

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by.hpp
# Opt level: O0

tuple<int_&&,_int,_int_&&> * __thiscall
burst::by<1ul,DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_5()::__0&,std::tuple<int&&,int&&,int&&>>
          (tuple<int_&&,_int,_int_&&> *__return_storage_ptr__,burst *this,
          anon_class_1_0_00000001_for_f *f,tuple<int_&&,_int_&&,_int_&&> *t)

{
  unsigned_long size;
  tuple<int_&&,_int_&&,_int_&&> *t_local;
  anon_class_1_0_00000001_for_f *f_local;
  
  detail::
  by_impl<1ul,0ul,2ul,DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_5()::__0&,std::tuple<int&&,int&&,int&&>>
            (__return_storage_ptr__,(detail *)this,f);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) by (UnaryFunction && f, Tuple && t)
    {
        constexpr auto size = std::tuple_size<std::decay_t<Tuple>>::value;
        static_assert(Index < size, "Попытка преобразовать несуществующий элемент кортежа");
        return
            detail::by_impl<Index>
            (
                make_index_range<0, Index>{},
                make_index_range<Index + 1, size>{},
                std::forward<UnaryFunction>(f),
                std::forward<Tuple>(t)
            );
    }